

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,int options
                  )

{
  xmlParserInputPtr input;
  htmlDocPtr pxVar1;
  
  if (-1 < size && ctxt != (htmlParserCtxtPtr)0x0) {
    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromMemory
                      (ctxt,URL,buffer,(ulong)(uint)size,encoding,XML_INPUT_BUF_STATIC);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = htmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (size < 0))
        return (NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, URL, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}